

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

monster_race * poly_race(monster_race *race,wchar_t current_level)

{
  wchar_t wVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t local_48;
  wchar_t local_40;
  monster_race *new_race;
  wchar_t local_28;
  wchar_t goal;
  wchar_t maxlvl;
  wchar_t minlvl;
  wchar_t i;
  wchar_t current_level_local;
  monster_race *race_local;
  
  if ((race != (monster_race *)0x0) && (race->name != (char *)0x0)) {
    _Var2 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
    race_local = race;
    if (!_Var2) {
      wVar1 = race->level;
      if ((race->level * 3) / 4 < race->level + L'\xfffffff6') {
        local_40 = (race->level * 3) / 4;
      }
      else {
        local_40 = race->level + L'\xfffffff6';
      }
      if (race->level + L'\n' < (race->level * 5) / 4) {
        local_48 = (race->level * 5) / 4;
      }
      else {
        local_48 = race->level + L'\n';
      }
      local_28 = local_48;
      uVar3 = Rand_div(100);
      if (uVar3 == 0) {
        local_28 = L'd';
      }
      maxlvl = L'\0';
      while ((race_local = race, maxlvl < L'Ϩ' &&
             ((((race_local = get_mon_num((current_level + wVar1) / 2 + L'\x05',current_level),
                race_local == (monster_race *)0x0 || (race_local == race)) ||
               (_Var2 = flag_has_dbg(race_local->flags,0xc,1,"new_race->flags","RF_UNIQUE"), _Var2))
              || (((race_local->level < local_40 || (local_28 < race_local->level)) ||
                  ((_Var2 = flag_has_dbg(race_local->flags,0xc,0xc,"new_race->flags",
                                         "RF_FORCE_DEPTH"), _Var2 &&
                   (current_level < race_local->level))))))))) {
        maxlvl = maxlvl + L'\x01';
      }
    }
    return race_local;
  }
  __assert_fail("race && race->name",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/project-mon.c"
                ,0x32,"struct monster_race *poly_race(struct monster_race *, int)");
}

Assistant:

static struct monster_race *poly_race(struct monster_race *race,
		int current_level)
{
	int i, minlvl, maxlvl, goal;

	assert(race && race->name);

	/* Uniques never polymorph */
	if (rf_has(race->flags, RF_UNIQUE)) return race;

	/* Allowable range of "levels" for resulting monster */
	goal = (current_level + race->level) / 2 + 5;
	minlvl = MIN(race->level - 10, (race->level * 3) / 4);
	maxlvl = MAX(race->level + 10, (race->level * 5) / 4);

	/* Small chance to allow something really strong */
	if (one_in_(100)) maxlvl = 100;

	/* Try to pick a new, non-unique race within our level range */
	for (i = 0; i < 1000; i++) {
		struct monster_race *new_race = get_mon_num(goal, current_level);

		if (!new_race || new_race == race) continue;
		if (rf_has(new_race->flags, RF_UNIQUE)) continue;
		if (new_race->level < minlvl || new_race->level > maxlvl) continue;

		/* Avoid force-depth monsters, since it might cause a crash in project_m() */
		if (rf_has(new_race->flags, RF_FORCE_DEPTH) && current_level < new_race->level) continue;

		return new_race;
	}

	/* If we get here, we weren't able to find a new race. */
	return race;
}